

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_serializer_test.cc
# Opt level: O3

void __thiscall
prometheus::anon_unknown_0::TextSerializerTest_shouldSerializeHistogram_Test::
~TextSerializerTest_shouldSerializeHistogram_Test
          (TextSerializerTest_shouldSerializeHistogram_Test *this)

{
  pointer pBVar1;
  pointer pQVar2;
  pointer pcVar3;
  
  (this->super_TextSerializerTest).super_Test._vptr_Test =
       (_func_int **)&PTR__TextSerializerTest_001b2398;
  pBVar1 = (this->super_TextSerializerTest).metric.histogram.bucket.
           super__Vector_base<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pBVar1 != (pointer)0x0) {
    operator_delete(pBVar1);
  }
  pQVar2 = (this->super_TextSerializerTest).metric.summary.quantile.
           super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pQVar2 != (pointer)0x0) {
    operator_delete(pQVar2);
  }
  std::vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>::
  ~vector(&(this->super_TextSerializerTest).metric.label);
  pcVar3 = (this->super_TextSerializerTest).name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->super_TextSerializerTest).name.field_2) {
    operator_delete(pcVar3);
  }
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(TextSerializerTest, shouldSerializeHistogram) {
  Histogram histogram{{1}};
  histogram.Observe(0);
  histogram.Observe(200);
  metric = histogram.Collect();

  const auto serialized = Serialize(MetricType::Histogram);
  EXPECT_THAT(serialized, testing::HasSubstr(name + "_count 2\n"));
  EXPECT_THAT(serialized, testing::HasSubstr(name + "_sum 200\n"));
  EXPECT_THAT(serialized, testing::HasSubstr(name + "_bucket{le=\"1\"} 1\n"));
  EXPECT_THAT(serialized,
              testing::HasSubstr(name + "_bucket{le=\"+Inf\"} 2\n"));
}